

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_delete.cpp
# Opt level: O2

unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true> __thiscall
duckdb::Transformer::TransformDelete(Transformer *this,PGDeleteStmt *stmt)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  PGList *list;
  optional_ptr<duckdb_libpgquery::PGNode,_true> oVar3;
  PGWithClause *de_with_clause;
  pointer pDVar4;
  pointer pTVar5;
  InvalidInputException *this_00;
  long in_RDX;
  pointer *__ptr;
  undefined8 *puVar6;
  undefined1 local_58 [8];
  optional_ptr<duckdb_libpgquery::PGNode,_true> target;
  
  make_uniq<duckdb::DeleteStatement>();
  if (*(PGNode **)(in_RDX + 0x28) != (PGNode *)0x0) {
    target.ptr = *(PGNode **)(in_RDX + 0x28);
    de_with_clause =
         optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                   ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)&target);
    pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
             ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                           *)this);
    TransformCTE((Transformer *)stmt,de_with_clause,&pDVar4->cte_map);
  }
  TransformExpression((Transformer *)&target,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  oVar3 = target;
  target.ptr = (PGNode *)0x0;
  _Var1._M_head_impl =
       (pDVar4->condition).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pDVar4->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)oVar3.ptr;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    if (target.ptr != (PGNode *)0x0) {
      (**(code **)(*(long *)target.ptr + 8))();
    }
  }
  TransformRangeVar((Transformer *)&target,(PGRangeVar *)stmt);
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  oVar3 = target;
  target.ptr = (PGNode *)0x0;
  _Var2._M_head_impl =
       (pDVar4->table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pDVar4->table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)oVar3.ptr;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    if (target.ptr != (PGNode *)0x0) {
      (**(code **)(*(long *)target.ptr + 8))();
    }
  }
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     (&pDVar4->table);
  if (pTVar5->type == BASE_TABLE) {
    puVar6 = *(undefined8 **)(in_RDX + 0x10);
    if (puVar6 != (undefined8 *)0x0) {
      while (puVar6 = (undefined8 *)puVar6[1], puVar6 != (undefined8 *)0x0) {
        target.ptr = (PGNode *)*puVar6;
        optional_ptr<duckdb_libpgquery::PGNode,_true>::operator*(&target);
        TransformTableRefNode((Transformer *)local_58,(PGNode *)stmt);
        pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                 ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                               *)this);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>>
                    *)&pDVar4->using_clauses,
                   (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   local_58);
        if (local_58 != (undefined1  [8])0x0) {
          (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_58)->ptr->options)();
        }
      }
    }
    list = *(PGList **)(in_RDX + 0x20);
    if (list != (PGList *)0x0) {
      pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
               ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                             *)this);
      TransformExpressionList((Transformer *)stmt,list,&pDVar4->returning_list);
    }
    return (unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>_>)
           (unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>_>)this;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&target,"Can only delete from base tables!",(allocator *)local_58);
  InvalidInputException::InvalidInputException(this_00,(string *)&target);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<DeleteStatement> Transformer::TransformDelete(duckdb_libpgquery::PGDeleteStmt &stmt) {
	auto result = make_uniq<DeleteStatement>();
	if (stmt.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), result->cte_map);
	}

	result->condition = TransformExpression(stmt.whereClause);
	result->table = TransformRangeVar(*stmt.relation);
	if (result->table->type != TableReferenceType::BASE_TABLE) {
		throw InvalidInputException("Can only delete from base tables!");
	}
	if (stmt.usingClause) {
		for (auto n = stmt.usingClause->head; n != nullptr; n = n->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(n->data.ptr_value);
			auto using_entry = TransformTableRefNode(*target);
			result->using_clauses.push_back(std::move(using_entry));
		}
	}

	if (stmt.returningList) {
		TransformExpressionList(*stmt.returningList, result->returning_list);
	}

	return result;
}